

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggreports.cpp
# Opt level: O2

void __thiscall
aggreports::WritePerSampleExceedanceProbabilityTable
          (aggreports *this,vector<int,_std::allocator<int>_> *fileIDs,
          map<wheatkey,_std::vector<float,_std::allocator<float>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>_>_>
          *items,int eptype,int eptype_tvar)

{
  OASIS_FLOAT current_loss;
  pointer pfVar1;
  mapped_type *this_00;
  code *pcVar2;
  _Base_ptr p_Var3;
  pointer piVar4;
  pointer pfVar5;
  long *plVar6;
  int counter;
  double current_return_period;
  float local_e4;
  OASIS_FLOAT last_computed_loss;
  size_t nextreturnperiodindex;
  double local_d0;
  double local_c8;
  int local_bc;
  undefined1 local_b8 [16];
  pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> s;
  double last_computed_rp;
  _Base_ptr local_80;
  _Base_ptr local_78;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_70;
  reverse_iterator<__gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>_>
  local_68;
  map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
  tail;
  
  if ((items->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) {
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tail._M_t._M_impl.super__Rb_tree_header._M_header;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tail._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8 = (double)this->totalperiods_;
    local_80 = &(items->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = (items->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    local_bc = eptype_tvar;
    tail._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tail._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var3 != local_80) {
      std::pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_>::pair
                (&s,(pair<const_wheatkey,_std::vector<float,_std::allocator<float>_>_> *)
                    (p_Var3 + 1));
      local_68.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_70.current._M_current =
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
           s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_78 = p_Var3;
      std::
      sort<std::reverse_iterator<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>>
                (&local_68,&local_70);
      pfVar1 = s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish;
      nextreturnperiodindex = 0;
      last_computed_rp = 0.0;
      last_computed_loss = 0.0;
      local_e4 = 0.0;
      counter = 1;
      for (pfVar5 = s.second.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start; pfVar5 != pfVar1; pfVar5 = pfVar5 + 1) {
        current_loss = *pfVar5;
        if (this->useReturnPeriodFile_ == true) {
          local_b8._0_8_ = this->WritePSEPTOutput;
          local_b8._8_8_ = *(undefined8 *)&this->field_0x168;
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                     local_c8 / (double)counter,current_loss,s.first.summary_id,eptype,s.first.sidx,
                     local_c8,counter,local_e4,&tail,local_b8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_b8._8_8_);
          local_e4 = local_e4 - (local_e4 - current_loss) / (float)counter;
        }
        else {
          local_d0 = local_c8 / (double)counter;
          this_00 = std::
                    map<wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
                    ::operator[](&tail,&s.first);
          local_e4 = local_e4 - (local_e4 - current_loss) / (float)counter;
          local_b8._0_8_ = local_d0;
          local_b8._8_4_ = local_e4;
          std::vector<TVaR,_std::allocator<TVaR>_>::emplace_back<TVaR>(this_00,(TVaR *)local_b8);
          pcVar2 = (code *)this->WritePSEPTOutput;
          if (pcVar2 != (code *)0x0) {
            plVar6 = (long *)((long)&this->totalperiods_ + *(long *)&this->field_0x168);
            if (((ulong)pcVar2 & 1) != 0) {
              pcVar2 = *(code **)(pcVar2 + *plVar6 + -1);
            }
            (*pcVar2)(local_d0,current_loss,plVar6,fileIDs,s.first.summary_id,s.first.sidx,eptype);
          }
        }
        counter = counter + 1;
      }
      if (this->useReturnPeriodFile_ == true) {
        piVar4 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          current_return_period = 0.0;
          if (0 < piVar4[nextreturnperiodindex]) {
            current_return_period = local_c8 / (double)counter;
          }
          local_b8._0_8_ = this->WritePSEPTOutput;
          local_b8._8_8_ = *(undefined8 *)&this->field_0x168;
          WriteReturnPeriodOut<std::map<wheatkey,std::vector<TVaR,std::allocator<TVaR>>,std::less<wheatkey>,std::allocator<std::pair<wheatkey_const,std::vector<TVaR,std::allocator<TVaR>>>>>>
                    (this,fileIDs,&nextreturnperiodindex,&last_computed_rp,&last_computed_loss,
                     current_return_period,0.0,s.first.summary_id,eptype,s.first.sidx,local_c8,
                     counter,local_e4,&tail,local_b8._0_8_,
                     (map<int,_std::vector<mean_count,_std::allocator<mean_count>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<mean_count,_std::allocator<mean_count>_>_>_>_>
                      *)local_b8._8_8_);
          local_e4 = local_e4 - local_e4 / (float)counter;
          counter = counter + 1;
          piVar4 = (this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (nextreturnperiodindex <
                 (ulong)((long)(this->returnperiods_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar4 >> 2));
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&s.second.super__Vector_base<float,_std::allocator<float>_>);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(local_78);
    }
    if ((this->ordFlag_ != false) && (this->fout_[1] != (FILE *)0x0)) {
      WriteTVaR(this,fileIDs,local_bc,&tail);
    }
    std::
    _Rb_tree<wheatkey,_std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>,_std::_Select1st<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>,_std::less<wheatkey>,_std::allocator<std::pair<const_wheatkey,_std::vector<TVaR,_std::allocator<TVaR>_>_>_>_>
    ::~_Rb_tree(&tail._M_t);
  }
  return;
}

Assistant:

void aggreports::WritePerSampleExceedanceProbabilityTable(
	const std::vector<int> &fileIDs, std::map<wheatkey, lossvec> &items,
	int eptype, int eptype_tvar) {

  if (items.size() == 0) return;

#ifdef ORD_OUTPUT
  if (os_psept_exists_ == false) {
  	if (parquetFileNames_[PSEPT] != "") {
		os_psept_ = GetParquetStreamWriter(PSEPT);
		os_psept_exists_ = true;
	}
  }
#endif

  std::map<wheatkey, std::vector<TVaR>> tail;
  const double max_retperiod = totalperiods_;

  for (auto s : items) {
    lossvec &lpv = s.second;
    std::sort(lpv.rbegin(), lpv.rend());
    size_t nextreturnperiodindex = 0;
    double last_computed_rp = 0;
    OASIS_FLOAT last_computed_loss = 0;
    OASIS_FLOAT tvar = 0;
    int i = 1;

    for (auto lp : lpv) {
      double retperiod = max_retperiod / i;

      if (useReturnPeriodFile_) {
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, lp,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - ((tvar - lp) / i);
      } else {
	tvar = tvar - ((tvar - lp) / i);
	tail[s.first].push_back({retperiod, tvar});
	if (WritePSEPTOutput != nullptr) {
	  (this->*WritePSEPTOutput)(fileIDs, s.first.summary_id, s.first.sidx,
				    eptype, retperiod, lp);
	}
#ifdef ORD_OUTPUT
	// TODO: Rather than checking for this on every iteration, it may be
	// more efficient to create a new class that inherits from
	// parquet::StreamWriter and implement the ios::setstate() function. In
	// this way, the state can be set to std::ios_base::badbit if needed.
	if (parquetFileNames_[PSEPT] != "") {
	  WriteParquetOutput(os_psept_, s.first.summary_id, s.first.sidx,
			     eptype, retperiod, lp);
	}
#endif
      }
      i++;
    }
    if (useReturnPeriodFile_) {
      do {
	double retperiod = max_retperiod / i;
	if (returnperiods_[nextreturnperiodindex] <= 0) retperiod = 0;
#ifdef ORD_OUTPUT
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput,
			     os_psept_);
#else
	WriteReturnPeriodOut(fileIDs, nextreturnperiodindex, last_computed_rp,
			     last_computed_loss, retperiod, 0,
			     s.first.summary_id, eptype, s.first.sidx,
			     max_retperiod, i, tvar, tail, WritePSEPTOutput);
#endif
	tvar = tvar - (tvar / i);
	i++;
      } while (nextreturnperiodindex < returnperiods_.size());
    }
  }

  // Only write Tail Value at Risk (TVaR) for ORD output
  if (!ordFlag_) return;
  if (fout_[PSEPT] != nullptr) WriteTVaR(fileIDs, eptype_tvar, tail);
#ifdef ORD_OUTPUT
  if (parquetFileNames_[PSEPT] != "") WriteTVaR(os_psept_, eptype_tvar, tail);
#endif

}